

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureUnitTests.cpp
# Opt level: O3

void __thiscall
deqp::gles2::Functional::TextureUnitCase::render(TextureUnitCase *this,Context *context)

{
  int iVar1;
  int iVar2;
  Texture2D *pTVar3;
  TextureCube *pTVar4;
  long lVar5;
  pointer pTVar6;
  int iVar7;
  uint uVar8;
  deUint32 dVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  long local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> textureGLNames;
  vector<bool,_std::allocator<bool>_> local_78;
  Vec3 local_50;
  Vec3 local_40;
  
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40.m_data._0_8_ = local_40.m_data._0_8_ & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_78,(long)this->m_numTextures,(bool *)&local_40,(allocator_type *)&local_50);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&textureGLNames,(long)this->m_numTextures);
  (*context->_vptr_Context[7])
            (context,(ulong)(uint)this->m_numTextures,
             textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (0 < this->m_numUnits) {
    lVar15 = 0;
    do {
      iVar1 = (this->m_unitTextures).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15];
      uVar16 = (ulong)iVar1;
      (*context->_vptr_Context[4])(context,(ulong)((int)lVar15 + 0x84c0));
      (*context->_vptr_Context[6])
                (context,(ulong)(this->m_textureTypes).
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start[uVar16],
                 (ulong)textureGLNames.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar16]);
      iVar7 = iVar1 + 0x3f;
      if (-1 < iVar1) {
        iVar7 = iVar1;
      }
      uVar14 = (ulong)((uVar16 & 0x800000000000003f) < 0x8000000000000001);
      if ((local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[(long)(iVar7 >> 6) + (uVar14 - 1)] >>
           (uVar16 & 0x3f) & 1) == 0) {
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar16],0x2802,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16].wrapModeS);
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar16],0x2803,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16].wrapModeT);
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar16],0x2801,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16].minFilter);
        (*context->_vptr_Context[0x1d])
                  (context,(ulong)(this->m_textureTypes).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar16],0x2800,
                   (ulong)(this->m_textureParams).
                          super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar16].magFilter);
        iVar2 = (this->m_ndx2dOrCube).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar16];
        if ((this->m_textureTypes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar16] == 0xde1) {
          pTVar3 = (this->m_textures2d).
                   super__Vector_base<tcu::Texture2D_*,_std::allocator<tcu::Texture2D_*>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar2];
          uVar11 = pTVar3->m_width;
          uVar8 = 1;
          if (((uVar11 & uVar11 - 1) == 0) &&
             (uVar12 = pTVar3->m_height, (uVar12 & uVar12 - 1) == 0)) {
            if ((int)uVar12 < (int)uVar11) {
              uVar12 = uVar11;
            }
            if (uVar12 == 0) {
              uVar8 = 0x20;
            }
            else {
              uVar8 = 0x1f;
              if (uVar12 != 0) {
                for (; uVar12 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              uVar8 = uVar8 ^ 0x1f;
            }
            uVar8 = 0x20 - uVar8;
          }
          (*context->_vptr_Context[0xf])(context,0xcf5,1);
          if (uVar8 != 0) {
            lVar13 = 8;
            uVar17 = 0;
            do {
              lVar5 = *(long *)&(pTVar3->super_TextureLevelPyramid).m_access.
                                super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data;
              pTVar6 = (this->m_textureParams).
                       super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar10 = (ulong)pTVar6[uVar16].format;
              (*context->_vptr_Context[0x11])
                        (context,0xde1,uVar17 & 0xffffffff,uVar10,(ulong)*(uint *)(lVar5 + lVar13),
                         (ulong)*(uint *)(lVar5 + 4 + lVar13),0,uVar10,
                         (ulong)pTVar6[uVar16].dataType,*(undefined8 *)(lVar5 + 0x18 + lVar13));
              uVar17 = uVar17 + 1;
              lVar13 = lVar13 + 0x28;
            } while (uVar8 != uVar17);
          }
        }
        else {
          pTVar4 = (this->m_texturesCube).
                   super__Vector_base<tcu::TextureCube_*,_std::allocator<tcu::TextureCube_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[iVar2];
          uVar11 = pTVar4->m_size;
          (*context->_vptr_Context[0xf])(context,0xcf5,1);
          if (uVar11 == 0) {
            uVar8 = 0x20;
          }
          else {
            uVar8 = 0x1f;
            if (uVar11 != 0) {
              for (; uVar11 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            uVar8 = uVar8 ^ 0x1f;
          }
          uVar11 = uVar11 - (uVar11 >> 1 & 0x55555555);
          uVar12 = (uVar11 >> 2 & 0x33333333) + (uVar11 & 0x33333333);
          uVar11 = 0x20 - uVar8;
          if (1 < ((uVar12 >> 4) + uVar12 & 0xf0f0f0f) * 0x1010101 >> 0x18) {
            uVar11 = 1;
          }
          local_e0 = 0;
          do {
            if ((ulong)uVar11 != 0) {
              uVar8 = *(uint *)(s_cubeFaceTargets + local_e0 * 4);
              lVar13 = 8;
              uVar17 = 0;
              do {
                lVar5 = (long)pTVar4->m_access[local_e0].
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                pTVar6 = (this->m_textureParams).
                         super__Vector_base<deqp::gles2::Functional::TextureUnitCase::TextureParameters,_std::allocator<deqp::gles2::Functional::TextureUnitCase::TextureParameters>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar10 = (ulong)pTVar6[uVar16].format;
                (*context->_vptr_Context[0x11])
                          (context,(ulong)uVar8,uVar17 & 0xffffffff,uVar10,
                           (ulong)*(uint *)(lVar5 + lVar13),(ulong)*(uint *)(lVar5 + 4 + lVar13),0,
                           uVar10,(ulong)pTVar6[uVar16].dataType,
                           *(undefined8 *)(lVar5 + 0x18 + lVar13));
                uVar17 = uVar17 + 1;
                lVar13 = lVar13 + 0x28;
              } while (uVar11 != uVar17);
            }
            local_e0 = local_e0 + 1;
          } while (local_e0 != 6);
        }
        local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p[(long)(iVar7 >> 6) + (uVar14 - 1)] =
             local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[(long)(iVar7 >> 6) + (uVar14 - 1)] |
             1L << ((byte)iVar1 & 0x3f);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < this->m_numUnits);
  }
  dVar9 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar9,"Set textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,900);
  dVar9 = (*context->_vptr_Context[0x75])(context,this->m_shader);
  (*context->_vptr_Context[0x2a])(0x3e000000,0x3e800000,0x3f000000,0x3f800000,context);
  (*context->_vptr_Context[0x2d])(context,0x4500);
  MultiTexShader::setUniforms(this->m_shader,context,dVar9);
  local_40.m_data[0] = -1.0;
  local_40.m_data[1] = -1.0;
  local_40.m_data[2] = 0.0;
  local_50.m_data[0] = 1.0;
  local_50.m_data[1] = 1.0;
  local_50.m_data[2] = 0.0;
  sglr::drawQuad(context,dVar9,&local_40,&local_50);
  dVar9 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar9,"Draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,0x390);
  (*context->_vptr_Context[8])
            (context,(ulong)(uint)this->m_numTextures,
             textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  dVar9 = (*context->_vptr_Context[0x79])(context);
  glu::checkError(dVar9,"Delete textures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureUnitTests.cpp"
                  ,0x395);
  if (local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_78.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  if (textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(textureGLNames.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)textureGLNames.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)textureGLNames.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TextureUnitCase::render (sglr::Context& context)
{
	// Setup textures.

	vector<deUint32>	textureGLNames;
	vector<bool>		isTextureSetUp(m_numTextures, false); // \note Same texture may be bound to multiple units, but we only want to set up parameters and data once per texture.

	textureGLNames.resize(m_numTextures);
	context.genTextures(m_numTextures, &textureGLNames[0]);

	for (int unitNdx = 0; unitNdx < m_numUnits; unitNdx++)
	{
		int texNdx = m_unitTextures[unitNdx];

		// Bind texture to unit.
		context.activeTexture(GL_TEXTURE0 + unitNdx);
		context.bindTexture(m_textureTypes[texNdx], textureGLNames[texNdx]);

		if (!isTextureSetUp[texNdx])
		{
			// Binding this texture for first time, so set parameters and data.

			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_S, m_textureParams[texNdx].wrapModeS);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_WRAP_T, m_textureParams[texNdx].wrapModeT);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MIN_FILTER, m_textureParams[texNdx].minFilter);
			context.texParameteri(m_textureTypes[texNdx], GL_TEXTURE_MAG_FILTER, m_textureParams[texNdx].magFilter);

			if (m_textureTypes[texNdx] == GL_TEXTURE_2D)
			{
				int						ndx2d		= m_ndx2dOrCube[texNdx];
				const tcu::Texture2D*	texture		= m_textures2d[ndx2d];
				bool					mipmaps		= (deIsPowerOfTwo32(texture->getWidth()) && deIsPowerOfTwo32(texture->getHeight()));
				int						numLevels	= mipmaps ? deLog2Floor32(de::max(texture->getWidth(), texture->getHeight()))+1 : 1;

				context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

				for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
				{
					tcu::ConstPixelBufferAccess		access	= texture->getLevel(levelNdx);
					int								width	= access.getWidth();
					int								height	= access.getHeight();

					DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

					context.texImage2D(GL_TEXTURE_2D, levelNdx, m_textureParams[texNdx].format, width, height, 0, m_textureParams[texNdx].format, m_textureParams[texNdx].dataType, access.getDataPtr());
				}
			}
			else
			{
				DE_ASSERT(m_textureTypes[texNdx] == GL_TEXTURE_CUBE_MAP);

				int							ndxCube		= m_ndx2dOrCube[texNdx];
				const tcu::TextureCube*		texture		= m_texturesCube[ndxCube];
				bool						mipmaps		= deIsPowerOfTwo32(texture->getSize()) != DE_FALSE;
				int							numLevels	= mipmaps ? deLog2Floor32(texture->getSize())+1 : 1;

				context.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

				for (int face = 0; face < (int)tcu::CUBEFACE_LAST; face++)
				{
					for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
					{
						tcu::ConstPixelBufferAccess		access	= texture->getLevelFace(levelNdx, (tcu::CubeFace)face);
						int								width	= access.getWidth();
						int								height	= access.getHeight();

						DE_ASSERT(access.getRowPitch() == access.getFormat().getPixelSize()*width);

						context.texImage2D(s_cubeFaceTargets[face], levelNdx, m_textureParams[texNdx].format, width, height, 0, m_textureParams[texNdx].format, m_textureParams[texNdx].dataType, access.getDataPtr());
					}
				}
			}

			isTextureSetUp[texNdx] = true; // Don't set up this texture's parameters and data again later.
		}
	}

	GLU_EXPECT_NO_ERROR(context.getError(), "Set textures");

	// Setup shader

	deUint32 shaderID = context.createProgram(m_shader);

	// Draw.

	context.clearColor(0.125f, 0.25f, 0.5f, 1.0f);
	context.clear(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);
	m_shader->setUniforms(context, shaderID);
	sglr::drawQuad(context, shaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
	GLU_EXPECT_NO_ERROR(context.getError(), "Draw");

	// Delete previously generated texture names.

	context.deleteTextures(m_numTextures, &textureGLNames[0]);
	GLU_EXPECT_NO_ERROR(context.getError(), "Delete textures");
}